

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tar.c
# Opt level: O2

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  mode_t mVar2;
  int iVar3;
  wchar_t wVar4;
  archive *paVar5;
  time_t tVar6;
  time_t tVar7;
  char *pcVar8;
  la_int64_t v2;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  char *pathname;
  wchar_t line;
  uchar *puVar15;
  bool bVar16;
  archive_entry *local_60;
  int local_54;
  uchar *local_50;
  archive *local_48;
  ulong local_40;
  archive_entry *ae;
  
  local_50 = sig;
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'\x96',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x97',0,"0",(long)iVar1,"archive_read_support_format_all(a)",paVar5);
  iVar1 = archive_read_support_filter_all(paVar5);
  iVar3 = (int)siglen;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x98',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",paVar5);
  if (iVar3 != 0) {
    iVar1 = archive_read_set_option(paVar5,(char *)0x0,"rockridge",(char *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\x9b',(uint)(iVar1 == 0),
                     "0 == archive_read_set_option(a, NULL, \"rockridge\", NULL)",paVar5);
    if (iVar3 != 1) {
      iVar1 = archive_read_set_option(paVar5,(char *)0x0,"joliet",(char *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'\x9e',(uint)(iVar1 == 0),
                       "0 == archive_read_set_option(a, NULL, \"joliet\", NULL)",paVar5);
    }
  }
  iVar1 = archive_read_open_memory(paVar5,ctx,(size_t)local_50);
  local_54 = iVar3;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x9f',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",paVar5);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¥',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
  tVar6 = archive_entry_atime(ae);
  tVar7 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¦',tVar6,"archive_entry_atime(ae)",tVar7,"archive_entry_ctime(ae)",
                      (void *)0x0);
  tVar6 = archive_entry_atime(ae);
  tVar7 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'§',tVar6,"archive_entry_atime(ae)",tVar7,"archive_entry_mtime(ae)",
                      (void *)0x0);
  pcVar8 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
             ,L'¨',".","\".\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  iVar1 = local_54;
  if (local_54 == 2) {
    wVar4 = (wchar_t)(mVar2 == 0x41c0);
    pcVar8 = "(S_IFDIR | 0700) == archive_entry_mode(ae)";
    line = L'±';
  }
  else if (local_54 == 1) {
    wVar4 = (wchar_t)(mVar2 == 0x41c0);
    pcVar8 = "(S_IFDIR | 0700) == archive_entry_mode(ae)";
    line = L'®';
  }
  else {
    wVar4 = (wchar_t)(mVar2 == 0x416d);
    pcVar8 = "(S_IFDIR | 0555) == archive_entry_mode(ae)";
    line = L'«';
  }
  local_48 = paVar5;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,line,wVar4,pcVar8,(void *)0x0);
  memset(*(void **)(tbs + 0x30),0,*(long *)(tbs + 0x20) << 3);
  tbs[0x28] = '\0';
  tbs[0x29] = '\0';
  tbs[0x2a] = '\0';
  tbs[0x2b] = '\0';
  uVar14 = 0;
  while (paVar5 = local_48, uVar13 = *(ulong *)(tbs + 0x20), uVar14 < uVar13) {
    local_40 = uVar14;
    iVar3 = archive_read_next_header(local_48,&local_60);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'N',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",paVar5);
    if (iVar1 == 0) {
      tVar6 = archive_entry_birthtime(local_60);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'P',2,"2",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
      tVar6 = archive_entry_atime(local_60);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'Q',3,"3",tVar6,"archive_entry_atime(ae)",(void *)0x0);
      tVar6 = archive_entry_ctime(local_60);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'R',4,"4",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
    }
    else {
      wVar4 = archive_entry_birthtime_is_set(local_60);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'T',0,"0",(long)wVar4,"archive_entry_birthtime_is_set(ae)",(void *)0x0);
      tVar6 = archive_entry_atime(local_60);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'U',5,"5",tVar6,"archive_entry_atime(ae)",(void *)0x0);
      tVar6 = archive_entry_ctime(local_60);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'V',5,"5",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
    }
    tVar6 = archive_entry_mtime(local_60);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'X',5,"5",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
    mVar2 = archive_entry_mode(local_60);
    if (local_54 == 0) {
      bVar16 = mVar2 == 0x816d;
      wVar4 = L'Z';
      pcVar8 = "(S_IFREG | 0555) == archive_entry_mode(ae)";
    }
    else {
      bVar16 = mVar2 == 0x8100;
      wVar4 = L'\\';
      pcVar8 = "(S_IFREG | 0400) == archive_entry_mode(ae)";
    }
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,wVar4,(uint)bVar16,pcVar8,(void *)0x0);
    v2 = archive_entry_size(local_60);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L']',0,"0",v2,"archive_entry_size(ae)",(void *)0x0);
    for (puVar15 = (uchar *)0x0; iVar1 = *(int *)(tbs + 0x28),
        pcVar8 = archive_entry_pathname(local_60), (long)puVar15 < (long)iVar1;
        puVar15 = puVar15 + 1) {
      pcVar9 = archive_entry_symlink(local_60);
      if (pcVar9 != (char *)0x0) {
        local_50 = puVar15;
        sVar10 = strlen(pcVar9);
        wVar4 = L'\x01';
        if ((sVar10 != 1) && (sVar10 != 0x80)) {
          wVar4 = (wchar_t)(sVar10 == 0xff);
        }
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                         ,L'j',wVar4,"length == 1 || length == 128 || length == 255",(void *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'k',(long)pcVar9[sVar10 - 1],"symlinkname[length-1]",0x78,"\'x\'",
                            (void *)0x0);
        puVar15 = local_50;
      }
      failure("Found duplicate for %s",pcVar8);
      iVar1 = strcmp(*(char **)(*(long *)(tbs + 0x30) + (long)puVar15 * 8),pcVar8);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'n',(uint)(iVar1 != 0),"strcmp(fns->names[i], pathname) != 0",(void *)0x0);
      sVar10 = strlen(pcVar8);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'o',(uint)(sVar10 <= *(ulong *)tbs),
                       "(length = strlen(pathname)) <= fns->maxlen",(void *)0x0);
      if (*(ulong *)(tbs + 8) < sVar10) {
        *(size_t *)(tbs + 8) = sVar10;
      }
      pcVar11 = strrchr(pcVar8,0x2e);
      pcVar9 = pcVar8;
      if (pcVar11 != (char *)0x0) {
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                         ,L'u',(uint)((ulong)((long)pcVar11 - (long)pcVar8) <=
                                     *(ulong *)(tbs + 0x10)),
                         "(size_t)(p - pathname) <= fns->maxflen",(void *)0x0);
        sVar10 = strlen(pcVar11 + 1);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                         ,L'w',(uint)(sVar10 <= *(ulong *)(tbs + 0x18)),
                         "strlen(p+1) <= fns->maxelen",(void *)0x0);
        if ((tbs[0x38] & 2) != 0) {
          pcVar12 = strchr(pcVar8,0x2e);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                           ,L'z',(uint)(pcVar12 == pcVar11),"strchr(pathname, \'.\') == p",
                           (void *)0x0);
        }
      }
      while( true ) {
        if ((*pcVar9 == '\0') || ((*(uint *)(tbs + 0x38) & 1) == 0)) break;
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                         ,L'\x80',(uint)((byte)(*pcVar9 + 0x85U) < 0xe6),"*p < \'a\' || *p > \'z\'",
                         (void *)0x0);
        pcVar9 = pcVar9 + 1;
      }
      if ((*(uint *)(tbs + 0x38) & 4) == 0) {
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                         ,L'\x86',(uint)(*pcVar8 != '.'),"*pathname != \'.\'",(void *)0x0);
      }
    }
    pcVar8 = strdup(pcVar8);
    iVar1 = *(int *)(tbs + 0x28);
    *(int *)(tbs + 0x28) = iVar1 + 1;
    *(char **)(*(long *)(tbs + 0x30) + (long)iVar1 * 8) = pcVar8;
    iVar1 = local_54;
    uVar14 = local_40 + 1;
  }
  for (uVar14 = 0; uVar14 < uVar13; uVar14 = uVar14 + 1) {
    free(*(void **)(*(long *)(tbs + 0x30) + uVar14 * 8));
    uVar13 = *(ulong *)(tbs + 0x20);
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¾',(long)*(int *)(tbs + 8),"(int)fns->longest_len",(long)*(int *)tbs,
                      "(int)fns->maxlen",(void *)0x0);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ã',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
  iVar1 = archive_read_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
  iVar1 = archive_read_free(paVar5);
  wVar4 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                              ,L'Å',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",paVar5);
  return wVar4;
}

Assistant:

static void verify(unsigned char *d, size_t s,
    void (*f)(struct archive_entry *),
    int compression, int format)
{
	struct archive_entry *ae;
	struct archive *a;
	unsigned char *buff = malloc(100000);

	memcpy(buff, d, s);
	memset(buff + s, 0, 2048);

	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_memory(a, buff, s + 1024));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), compression);
	assertEqualInt(archive_format(a), format);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify the only entry. */
	f(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(buff);
}